

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_sendto_op.hpp
# Opt level: O1

void asio::detail::
     reactive_socket_sendto_op<asio::const_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:797:17)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:797:17),_std::error_code,_unsigned_long>
  handler;
  ptr p;
  anon_class_8_1_6ca47d1a local_1f0;
  scheduler_operation *local_1e8;
  func_type p_Stack_1e0;
  size_t local_1d8;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  ptr local_1b0;
  undefined1 local_198 [392];
  
  local_1f0.requestBytes = *(size_t *)&base[4].task_result_;
  local_1b0.h = &local_1f0;
  local_1e8 = base[1].next_;
  p_Stack_1e0 = base[1].func_;
  local_1d8 = *(size_t *)&base[1].task_result_;
  local_1b0.v = (reactive_socket_sendto_op<asio::const_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:797:17)>
                 *)base;
  local_1b0.p = (reactive_socket_sendto_op<asio::const_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:797:17)>
                 *)base;
  ptr::reset(&local_1b0);
  if (owner != (void *)0x0) {
    if ((int)local_1e8 == 0) {
      if ((local_1f0.requestBytes != local_1d8) && (DAT_001e6cd0 < 4)) {
        poVar1 = (ostringstream *)(local_198 + 0x10);
        local_198._0_8_ = tonk::gateway::ModuleLogger;
        local_198._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001e6d00,DAT_001e6d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"async_send_to sent partial bytes = ",0x23);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
    }
    else {
      (**(code **)(*(long *)p_Stack_1e0 + 0x20))(&local_1d0);
      if (DAT_001e6cd0 < 4) {
        poVar1 = (ostringstream *)(local_198 + 0x10);
        local_198._0_8_ = tonk::gateway::ModuleLogger;
        local_198._8_4_ = Warning;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001e6d00,DAT_001e6d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"async_send_to returned with error: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1d0,local_1c8);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
    }
  }
  ptr::reset(&local_1b0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_sendto_op* o(static_cast<reactive_socket_sendto_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }